

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * whereOrName(sqlite3 *db,char *zWhere,char *zConstant)

{
  char *pcVar1;
  
  if (zWhere != (char *)0x0) {
    pcVar1 = sqlite3MPrintf(db,"%s OR name=%Q",zWhere);
    sqlite3DbFreeNN(db,zWhere);
    return pcVar1;
  }
  pcVar1 = sqlite3MPrintf(db,"name=%Q",zConstant);
  return pcVar1;
}

Assistant:

static char *whereOrName(sqlite3 *db, char *zWhere, char *zConstant){
  char *zNew;
  if( !zWhere ){
    zNew = sqlite3MPrintf(db, "name=%Q", zConstant);
  }else{
    zNew = sqlite3MPrintf(db, "%s OR name=%Q", zWhere, zConstant);
    sqlite3DbFree(db, zWhere);
  }
  return zNew;
}